

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_msg_devid.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint16_t uVar1;
  int iVar2;
  undefined8 *in_RSI;
  int in_EDI;
  uint16_t devid;
  in_addr unaff_retaddr;
  in_addr addr;
  undefined1 local_14 [4];
  undefined8 *local_10;
  int local_4;
  
  local_4 = 0;
  if (in_EDI < 2) {
    printf("usage: %s [NetTLP host addr]\n",*in_RSI);
    local_4 = -1;
  }
  else {
    local_10 = in_RSI;
    iVar2 = inet_pton(2,(char *)in_RSI[1],local_14);
    if (iVar2 < 1) {
      printf("invalid addr %s\n",local_10[1]);
      local_4 = -1;
    }
    else {
      uVar1 = nettlp_msg_get_dev_id(unaff_retaddr);
      printf("dev id is 0x%x\n",(ulong)uVar1);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
	struct in_addr addr;
	uint16_t devid;

	if (argc < 2) {
		printf("usage: %s [NetTLP host addr]\n", argv[0]);
		return -1;
	}

	if (inet_pton(AF_INET, argv[1], &addr) < 1) {
		printf("invalid addr %s\n", argv[1]);
		return -1;
	}

	devid = nettlp_msg_get_dev_id(addr);
	printf("dev id is 0x%x\n", devid);

	return 0;
}